

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O2

void __thiscall irr::scene::CAnimatedMeshSceneNode::beginTransition(CAnimatedMeshSceneNode *this)

{
  pointer pCVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  u32 n;
  ulong uVar4;
  long lVar5;
  CMatrix4<float> local_70;
  
  if (this->JointsUsed == true) {
    if (this->TransitionTime != 0) {
      uVar4 = (ulong)((long)(this->PretransitingSave).m_data.
                            super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->PretransitingSave).m_data.
                           super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
      ppIVar2 = (this->JointChildSceneNodes).m_data.
                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar3 = (this->JointChildSceneNodes).m_data.
                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((uint)uVar4 < (uint)((ulong)((long)ppIVar3 - (long)ppIVar2) >> 3)) {
        while( true ) {
          if ((uint)((ulong)((long)ppIVar3 - (long)ppIVar2) >> 3) <= (uint)uVar4) break;
          local_70.M[9] = 0.0;
          local_70.M[0xb] = 0.0;
          local_70.M[0xc] = 0.0;
          local_70.M[6] = 0.0;
          local_70.M[7] = 0.0;
          local_70.M[8] = 0.0;
          local_70.M[1] = 0.0;
          local_70.M[2] = 0.0;
          local_70.M[3] = 0.0;
          local_70.M[4] = 0.0;
          local_70.M[0xd] = 0.0;
          local_70.M[0xe] = 0.0;
          local_70.M[0xf] = 1.0;
          local_70.M[10] = 1.0;
          local_70.M[5] = 1.0;
          local_70.M[0] = 1.0;
          core::array<irr::core::CMatrix4<float>_>::push_back(&this->PretransitingSave,&local_70);
          uVar4 = (ulong)((uint)uVar4 + 1);
          ppIVar2 = (this->JointChildSceneNodes).m_data.
                    super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppIVar3 = (this->JointChildSceneNodes).m_data.
                    super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      lVar5 = 0;
      for (uVar4 = 0; uVar4 < ((ulong)((long)ppIVar3 - (long)ppIVar2) >> 3 & 0xffffffff);
          uVar4 = uVar4 + 1) {
        (**(code **)(**(long **)((long)ppIVar2 + lVar5) + 0x58))(&local_70);
        pCVar1 = (this->PretransitingSave).m_data.
                 super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)(pCVar1->M + lVar5 * 2U + 0xc) = CONCAT44(local_70.M[0xd],local_70.M[0xc]);
        *(ulong *)((long)(pCVar1->M + lVar5 * 2U + 0xc) + 8) =
             CONCAT44(local_70.M[0xf],local_70.M[0xe]);
        *(ulong *)(pCVar1->M + lVar5 * 2U + 8) = CONCAT44(local_70.M[9],local_70.M[8]);
        *(ulong *)((long)(pCVar1->M + lVar5 * 2U + 8) + 8) =
             CONCAT44(local_70.M[0xb],local_70.M[10]);
        *(ulong *)(pCVar1->M + lVar5 * 2U + 4) = CONCAT44(local_70.M[5],local_70.M[4]);
        *(ulong *)((long)(pCVar1->M + lVar5 * 2U + 4) + 8) = CONCAT44(local_70.M[7],local_70.M[6]);
        *(ulong *)(pCVar1->M + lVar5 * 2) = CONCAT44(local_70.M[1],local_70.M[0]);
        *(ulong *)(pCVar1->M + lVar5 * 2 + 2) = CONCAT44(local_70.M[3],local_70.M[2]);
        ppIVar2 = (this->JointChildSceneNodes).m_data.
                  super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppIVar3 = (this->JointChildSceneNodes).m_data.
                  super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar5 = lVar5 + 8;
      }
      this->Transiting = (f32)(1.0 / (float)this->TransitionTime);
    }
    this->TransitingBlend = 0.0;
  }
  return;
}

Assistant:

void CAnimatedMeshSceneNode::beginTransition()
{
	if (!JointsUsed)
		return;

	if (TransitionTime != 0) {
		// Check the array is big enough
		if (PretransitingSave.size() < JointChildSceneNodes.size()) {
			for (u32 n = PretransitingSave.size(); n < JointChildSceneNodes.size(); ++n)
				PretransitingSave.push_back(core::matrix4());
		}

		// Copy the position of joints
		for (u32 n = 0; n < JointChildSceneNodes.size(); ++n)
			PretransitingSave[n] = JointChildSceneNodes[n]->getRelativeTransformation();

		Transiting = core::reciprocal((f32)TransitionTime);
	}
	TransitingBlend = 0.f;
}